

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O1

char * __thiscall amrex::BaseFab<char>::dataPtr(BaseFab<char> *this,int n)

{
  if (this->dptr != (char *)0x0) {
    return this->dptr +
           (long)(((this->domain).bigend.vect[2] - (this->domain).smallend.vect[2]) + 1) *
           (long)(((this->domain).bigend.vect[1] - (this->domain).smallend.vect[1]) + 1) *
           (long)(((this->domain).bigend.vect[0] - (this->domain).smallend.vect[0]) + 1) * (long)n;
  }
  return (char *)0x0;
}

Assistant:

const T* dataPtr (int n = 0) const noexcept {
        if (this->dptr) {
            return &(this->dptr[n*this->domain.numPts()]);
        } else {
            return nullptr;
        }
    }